

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int stbtt__isfont(stbtt_uint8 *font)

{
  stbtt_uint8 sVar1;
  
  sVar1 = *font;
  if (sVar1 == '\0') {
    if (font[1] != '\x01') {
      return 0;
    }
  }
  else {
    if (sVar1 == 't') {
      if (font[1] != 'r') {
        if (font[1] != 'y') {
          return 0;
        }
        if (font[2] == 'p') {
          if (font[3] == '1') {
            return 1;
          }
          return 0;
        }
        return 0;
      }
      if (font[2] != 'u') {
        return 0;
      }
      if (font[3] == 'e') {
        return 1;
      }
      return 0;
    }
    if (sVar1 == 'O') {
      if (font[1] != 'T') {
        return 0;
      }
      if (font[2] != 'T') {
        return 0;
      }
      if (font[3] != 'O') {
        return 0;
      }
      return 1;
    }
    if (sVar1 != '1') {
      return 0;
    }
    if (font[1] != '\0') {
      return 0;
    }
  }
  if ((font[2] == '\0') && (font[3] == '\0')) {
    return 1;
  }
  return 0;
}

Assistant:

static int stbtt__isfont(stbtt_uint8 *font)
{
/*  check the version number */
if (stbtt_tag4(font, '1',0,0,0))  return 1; /*  TrueType 1 */
if (stbtt_tag(font, "typ1"))   return 1; /*  TrueType with type 1 font -- we don't support this! */
if (stbtt_tag(font, "OTTO"))   return 1; /*  OpenType with CFF */
if (stbtt_tag4(font, 0,1,0,0)) return 1; /*  OpenType 1.0 */
if (stbtt_tag(font, "true"))   return 1; /*  Apple specification for TrueType fonts */
return 0;
}